

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptSession.cpp
# Opt level: O2

ConstantValue * __thiscall
slang::ast::ScriptSession::evalExpression
          (ConstantValue *__return_storage_ptr__,ScriptSession *this,ExpressionSyntax *expr)

{
  int iVar1;
  undefined4 extraout_var;
  Scope *local_48;
  char local_40 [8];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_48 = &this->scope->super_Scope;
  local_40[0] = -1;
  local_40[1] = -1;
  local_40[2] = -1;
  local_40[3] = -1;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  iVar1 = Expression::bind((int)expr,(sockaddr *)&local_48,8);
  Expression::eval(__return_storage_ptr__,(Expression *)CONCAT44(extraout_var,iVar1),
                   &this->evalContext);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue ScriptSession::evalExpression(const ExpressionSyntax& expr) {
    ASTContext context(scope, LookupLocation::max);
    auto& bound = Expression::bind(expr, context, ASTFlags::AssignmentAllowed);
    return bound.eval(evalContext);
}